

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  uint uVar2;
  iterator iVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  pointer ppcVar8;
  float fVar9;
  size_type kSize;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r_2;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  Hasher local_150;
  Hasher local_140;
  SetKey<const_char_*,_Identity> local_132;
  Identity local_131;
  unsigned_long local_130;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_128;
  undefined1 local_d8 [24];
  iterator local_c0;
  nonempty_iterator local_b8;
  iterator local_b0;
  undefined1 local_a8;
  undefined1 local_a6;
  char *local_90;
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_80;
  AssertHelperData *local_48;
  
  local_130 = 0x400;
  *(undefined8 *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> + 0x20)
       = 0x3f4ccccd;
  fVar9 = (float)*(size_type *)
                  ((long)&(this->
                          super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                          ).
                          super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.
                          super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.table.settings + 0x10) * 0.8;
  uVar5 = (ulong)fVar9;
  *(ulong *)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.settings.
                    super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> + 0x10) =
       (long)(fVar9 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  *(size_type *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> + 0x18)
       = 0;
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
           + 0x28) = false;
  pcVar6 = UniqueObjectHelper<char_const*>(0x396);
  psVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.
            super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
           + 0x2a) = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = pcVar6;
  iVar7 = 1;
  do {
    local_128.first.ht =
         (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<char_const*>(iVar7);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_d8,psVar1,(const_reference)&local_128);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x334);
  local_128.first.ht =
       *(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.table.settings + 0x10);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_d8,"kSize","this->ht_.bucket_count()",&local_130,
             (unsigned_long *)&local_128);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_d8._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar8 = (pointer)0xaf1463;
    }
    else {
      ppcVar8 = *(pointer *)local_d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5ac,(char *)ppcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
    if (local_128.first.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_128.first.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar4 = local_d8._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_d8._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_d8._8_8_ !=
        &(((Settings *)(local_d8._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_d8._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  uVar2 = *(uint *)((long)&(this->
                           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           ).
                           super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           .ht_.
                           super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                           .ht_.settings.
                           super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> +
                   0x2c);
  iVar7 = 0x400;
  do {
    local_d8._0_8_ = UniqueObjectHelper<char_const*>(0x332);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::erase(psVar1,(key_type *)local_d8);
    local_128.first.ht =
         (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<char_const*>(0x332);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_d8,psVar1,(const_reference)&local_128);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  local_128.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_128.first.ht._4_4_,
                   *(uint *)((long)&(this->
                                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                    ).
                                    super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.
                                    super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                    .ht_.settings.
                                    super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
                            + 0x2c));
  local_150.id_ = uVar2 + 2;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)local_d8,"this->ht_.num_table_copies()","pre_copies + 2",(int *)&local_128,
             &local_150.id_);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_d8._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar8 = (pointer)0xaf1463;
    }
    else {
      ppcVar8 = *(pointer *)local_d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5b5,(char *)ppcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
    if (local_128.first.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_128.first.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_d8._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_d8._8_8_ !=
        &(((Settings *)(local_d8._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_d8._8_8_);
    }
    operator_delete((void *)local_d8._8_8_);
  }
  local_150._0_8_ = (AssertHelperData *)0x0;
  local_150.num_compares_ = 0;
  local_140.id_ = 0;
  local_140.num_hashes_ = 0;
  local_140.num_compares_ = 0;
  local_128.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_128.first.ht & 0xffffffff00000000);
  local_128.first.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  psVar1 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)(local_d8 + 8);
  local_d8._0_8_ = &PTR__BaseHashtableInterface_00c19198;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(psVar1,0,&local_150,&local_140,&local_131,&local_132,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)&local_128);
  local_d8._0_8_ = &PTR__BaseHashtableInterface_00c19118;
  pcVar6 = UniqueObjectHelper<char_const*>(0x396);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  local_a6 = 1;
  local_b0._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x3f4ccccd;
  uVar5 = (ulong)((float)local_48 * 0.8);
  local_c0._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((long)((float)local_48 * 0.8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5);
  local_b8 = (nonempty_iterator)0x0;
  local_a8 = 0;
  local_150._0_8_ = local_48;
  local_90 = pcVar6;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((internal *)&local_128,"ht2.bucket_count()","kSize",(unsigned_long *)&local_150,
             &local_130);
  if ((char)local_128.first.ht == '\0') {
    testing::Message::Message((Message *)&local_150);
    if (local_128.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar8 = (pointer)0xaf1463;
    }
    else {
      ppcVar8 = (local_128.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5be,(char *)ppcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if ((AssertHelperData *)local_150._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_150._0_8_ + 8))();
    }
  }
  iVar3._M_current = local_128.first.pos.row_begin._M_current;
  if (local_128.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_128.first.pos.row_begin._M_current)->group !=
        &((local_128.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_128.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar3._M_current);
  }
  iVar7 = 1;
  do {
    local_150._0_8_ = UniqueObjectHelper<char_const*>(iVar7);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_128,psVar1,(const_reference)&local_150);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x334);
  local_150._0_8_ = local_48;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_128,"ht2.bucket_count()","kSize",(unsigned_long *)&local_150,
             &local_130);
  if ((char)local_128.first.ht == '\0') {
    testing::Message::Message((Message *)&local_150);
    if (local_128.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar8 = (pointer)0xaf1463;
    }
    else {
      ppcVar8 = (local_128.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c2,(char *)ppcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if ((AssertHelperData *)local_150._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_150._0_8_ + 8))();
    }
  }
  iVar3._M_current = local_128.first.pos.row_begin._M_current;
  if (local_128.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_128.first.pos.row_begin._M_current)->group !=
        &((local_128.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_128.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar3._M_current);
  }
  iVar7 = 1;
  do {
    local_128.first.ht =
         (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<char_const*>(iVar7);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::erase(psVar1,(key_type *)&local_128);
    local_150._0_8_ = local_48;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_128,"ht2.bucket_count()","kSize",(unsigned_long *)&local_150,
               &local_130);
    if ((char)local_128.first.ht == '\0') {
      testing::Message::Message((Message *)&local_150);
      ppcVar8 = (pointer)0xaf1463;
      if (local_128.first.pos.row_begin._M_current !=
          (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        ppcVar8 = (local_128.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x5c5,(char *)ppcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
      if ((AssertHelperData *)local_150._0_8_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_150._0_8_ + 8))();
      }
    }
    iVar3._M_current = local_128.first.pos.row_begin._M_current;
    if (local_128.first.pos.row_begin._M_current !=
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((int **)(local_128.first.pos.row_begin._M_current)->group !=
          &((local_128.first.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_128.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar3._M_current);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x334);
  local_150._0_8_ = UniqueObjectHelper<char_const*>(0x334);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(psVar1,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_128,psVar1,(const_reference)&local_150);
  local_150._0_8_ = local_48;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&local_128,"ht2.bucket_count()","kSize",(unsigned_long *)&local_150,
             &local_130);
  if ((char)local_128.first.ht == '\0') {
    testing::Message::Message((Message *)&local_150);
    if (local_128.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar8 = (pointer)0xaf1463;
    }
    else {
      ppcVar8 = (local_128.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c8,(char *)ppcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if ((AssertHelperData *)local_150._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_150._0_8_ + 8))();
    }
  }
  iVar3._M_current = local_128.first.pos.row_begin._M_current;
  if (local_128.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_128.first.pos.row_begin._M_current)->group !=
        &((local_128.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_128.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar3._M_current);
  }
  local_d8._0_8_ = &PTR__BaseHashtableInterface_00c19198;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_80);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}